

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactive_socket_accept_op.hpp
# Opt level: O0

status webfront::http::std::experimental::net::v1::detail::
       reactive_socket_accept_op_base<std::experimental::net::v1::basic_stream_socket<std::experimental::net::v1::ip::tcp>,_std::experimental::net::v1::ip::tcp>
       ::do_perform(reactor_op *base)

{
  bool bVar1;
  long in_RDI;
  status result;
  socket_type new_socket;
  reactive_socket_accept_op_base<std::experimental::net::v1::basic_stream_socket<std::experimental::net::v1::ip::tcp>,_std::experimental::net::v1::ip::tcp>
  *o;
  size_t *in_stack_00000038;
  socket_addr_type *in_stack_00000040;
  state_type in_stack_0000004f;
  socket_type in_stack_00000050;
  socket_type s;
  data_type *local_28;
  
  if (*(long *)(in_RDI + 0x58) == 0) {
    local_28 = (data_type *)0x0;
  }
  else {
    local_28 = ip::basic_endpoint<std::experimental::net::v1::ip::tcp>::data
                         ((basic_endpoint<std::experimental::net::v1::ip::tcp> *)0x1373ed);
  }
  if (*(long *)(in_RDI + 0x58) == 0) {
    s = 0;
  }
  else {
    s = (socket_type)((ulong)(in_RDI + 0x60) >> 0x20);
  }
  bVar1 = socket_ops::non_blocking_accept
                    (in_stack_00000050,in_stack_0000004f,in_stack_00000040,in_stack_00000038,
                     (error_code *)base,(socket_type *)o);
  socket_holder::reset((socket_holder *)local_28,s);
  return (uint)bVar1;
}

Assistant:

static status do_perform(reactor_op* base)
  {
    reactive_socket_accept_op_base* o(
        static_cast<reactive_socket_accept_op_base*>(base));

    socket_type new_socket = invalid_socket;
    status result = socket_ops::non_blocking_accept(o->socket_,
        o->state_, o->peer_endpoint_ ? o->peer_endpoint_->data() : 0,
        o->peer_endpoint_ ? &o->addrlen_ : 0, o->ec_, new_socket)
    ? done : not_done;
    o->new_socket_.reset(new_socket);

    NET_TS_HANDLER_REACTOR_OPERATION((*o, "non_blocking_accept", o->ec_));

    return result;
  }